

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.h
# Opt level: O3

cmCMakePath * __thiscall cmCMakePath::Append(cmCMakePath *this,path *path)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  path local_38;
  
  std::filesystem::__cxx11::path::operator/=(&this->Path,path);
  std::filesystem::__cxx11::path::generic_string<char,std::char_traits<char>,std::allocator<char>>
            (&bStack_58,&this->Path,(allocator<char> *)&local_38);
  std::filesystem::__cxx11::path::path(&local_38,&bStack_58,auto_format);
  Append();
  return this;
}

Assistant:

cmCMakePath& Append(const cm::filesystem::path& path)
  {
    this->Path /= path;
    // filesystem::path::append use preferred_separator ('\' on Windows)
    // so convert back to '/'
    this->Path = this->Path.generic_string();
    return *this;
  }